

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O2

bool __thiscall cs::token_literal::dump(token_literal *this,ostream *o)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(o,"< Literal = \"");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_data);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_literal);
  std::operator<<(poVar1," >");
  return true;
}

Assistant:

bool dump(std::ostream &o) const override
		{
			o << "< Literal = \"" << m_data << "\"" << m_literal << " >";
			return true;
		}